

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuckinghamInteractionType.hpp
# Opt level: O0

void __thiscall
OpenMD::BuckinghamInteractionType::BuckinghamInteractionType
          (BuckinghamInteractionType *this,RealType myA,RealType myB,RealType myC,RealType mySigma,
          RealType myEpsilon,BuckinghamType myType)

{
  undefined4 in_ESI;
  NonBondedInteractionType *in_RDI;
  _func_int **in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  AtomType *in_XMM3_Qa;
  AtomType *in_XMM4_Qa;
  
  NonBondedInteractionType::NonBondedInteractionType(in_RDI);
  in_RDI->_vptr_NonBondedInteractionType = (_func_int **)&PTR__BuckinghamInteractionType_00483b08;
  in_RDI[1]._vptr_NonBondedInteractionType = in_XMM0_Qa;
  in_RDI[1].nbitp.is_LennardJones = (bool)(char)in_XMM1_Qa;
  in_RDI[1].nbitp.is_Morse = (bool)(char)((ulong)in_XMM1_Qa >> 8);
  in_RDI[1].nbitp.is_MAW = (bool)(char)((ulong)in_XMM1_Qa >> 0x10);
  in_RDI[1].nbitp.is_EAMTable = (bool)(char)((ulong)in_XMM1_Qa >> 0x18);
  in_RDI[1].nbitp.is_EAMZhou = (bool)(char)((ulong)in_XMM1_Qa >> 0x20);
  in_RDI[1].nbitp.is_EAMOxides = (bool)(char)((ulong)in_XMM1_Qa >> 0x28);
  in_RDI[1].nbitp.is_SC = (bool)(char)((ulong)in_XMM1_Qa >> 0x30);
  in_RDI[1].nbitp.is_RepulsivePower = (bool)(char)((ulong)in_XMM1_Qa >> 0x38);
  *(undefined8 *)&in_RDI[1].nbitp.is_Mie = in_XMM2_Qa;
  in_RDI[1].atomTypes_.first = in_XMM3_Qa;
  in_RDI[1].atomTypes_.second = in_XMM4_Qa;
  *(undefined4 *)&in_RDI[1].properties_._vptr_PropertyMap = in_ESI;
  NonBondedInteractionType::setBuckingham(in_RDI);
  return;
}

Assistant:

BuckinghamInteractionType(RealType myA, RealType myB, RealType myC,
                              RealType mySigma, RealType myEpsilon,
                              BuckinghamType myType) {
      A               = myA;
      B               = myB;
      C               = myC;
      sigma           = mySigma;
      epsilon         = myEpsilon;
      interactionType = myType;
      setBuckingham();
    }